

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_file_utils.cpp
# Opt level: O3

void crnlib::file_utils::combine_path(dynamic_string *dst,char *pA,char *pB)

{
  char *pcVar1;
  dynamic_string temp;
  dynamic_string dStack_28;
  
  dynamic_string::dynamic_string(&dStack_28,pA);
  if ((dStack_28.m_len != 0) && (*pB != '/')) {
    pcVar1 = "";
    if (dStack_28.m_pStr != (char *)0x0) {
      pcVar1 = dStack_28.m_pStr;
    }
    if (pcVar1[dStack_28.m_len - 1] != '/') {
      dynamic_string::append_char(&dStack_28,'/');
    }
  }
  dynamic_string::append(&dStack_28,pB);
  dynamic_string::swap(dst,&dStack_28);
  if ((dStack_28.m_pStr != (char *)0x0) &&
     ((*(uint *)(dStack_28.m_pStr + -8) ^ *(uint *)(dStack_28.m_pStr + -4)) == 0xffffffff)) {
    crnlib_free(dStack_28.m_pStr + -0x10);
  }
  return;
}

Assistant:

void file_utils::combine_path(dynamic_string& dst, const char* pA, const char* pB) {
  dynamic_string temp(pA);
  if ((!temp.is_empty()) && (!is_path_separator(pB[0]))) {
    char c = temp[temp.get_len() - 1];
    if (!is_path_separator(c))
      temp.append_char(CRNLIB_PATH_SEPERATOR_CHAR);
  }
  temp += pB;
  dst.swap(temp);
}